

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feerate.cpp
# Opt level: O0

CAmount __thiscall CFeeRate::GetFee(CFeeRate *this,uint32_t num_bytes)

{
  long lVar1;
  uint in_ESI;
  long *in_RDI;
  long in_FS_OFFSET;
  double dVar2;
  CAmount nFee;
  int64_t nSize;
  long local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  dVar2 = ceil((double)(long)(*in_RDI * (ulong)in_ESI) / 1000.0);
  local_28 = (long)dVar2;
  if ((local_28 == 0) && ((ulong)in_ESI != 0)) {
    if (0 < *in_RDI) {
      local_28 = 1;
    }
    if (*in_RDI < 0) {
      local_28 = -1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_28;
}

Assistant:

CAmount CFeeRate::GetFee(uint32_t num_bytes) const
{
    const int64_t nSize{num_bytes};

    // Be explicit that we're converting from a double to int64_t (CAmount) here.
    // We've previously had issues with the silent double->int64_t conversion.
    CAmount nFee{static_cast<CAmount>(std::ceil(nSatoshisPerK * nSize / 1000.0))};

    if (nFee == 0 && nSize != 0) {
        if (nSatoshisPerK > 0) nFee = CAmount(1);
        if (nSatoshisPerK < 0) nFee = CAmount(-1);
    }

    return nFee;
}